

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

bool adjustKeyPresses<short>(TKeyPressCollectionT<short> *keyPresses,TSimilarityMap *sim)

{
  TKeyPressPosition *pTVar1;
  pointer pvVar2;
  long lVar3;
  pointer psVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  size_type __n;
  int iVar10;
  TSimilarityMap *pTVar11;
  ulong uVar12;
  size_type __n_00;
  reference rVar13;
  allocator_type local_b2;
  bool local_b1;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  long local_98;
  TSimilarityMap *local_90;
  vector<Pair,_std::allocator<Pair>_> ccpairs;
  vector<bool,_std::allocator<bool>_> used;
  
  uVar6 = ((long)(keyPresses->
                 super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                 super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)(keyPresses->
                super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
                _M_impl.super__Vector_impl_data._M_start) / 0x30;
  ccpairs.super__Vector_base<Pair,_std::allocator<Pair>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ccpairs.super__Vector_base<Pair,_std::allocator<Pair>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  ccpairs.super__Vector_base<Pair,_std::allocator<Pair>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  iVar5 = (int)uVar6;
  iVar10 = 1;
  if (1 < iVar5) {
    iVar10 = iVar5;
  }
  local_a0 = (ulong)(iVar10 - 1);
  uVar12 = 1;
  lVar8 = 0x10;
  uVar7 = 0;
  local_90 = sim;
  while (uVar7 != local_a0) {
    local_a8 = uVar7 + 1;
    local_b0 = uVar12;
    local_98 = lVar8;
    for (; (uVar6 & 0xffffffff) != uVar12; uVar12 = uVar12 + 1) {
      used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p._0_4_ = (undefined4)uVar7;
      used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p._4_4_ = (undefined4)uVar12;
      used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._8_8_ =
           *(undefined8 *)
            (*(long *)&(local_90->
                       super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[uVar7].
                       super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl.
                       super__Vector_impl_data + lVar8);
      std::
      vector<adjustKeyPresses<short>(stKeyPressCollection<short>&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&)::Pair,std::allocator<adjustKeyPresses<short>(stKeyPressCollection<short>&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&)::Pair>>
      ::
      emplace_back<adjustKeyPresses<short>(stKeyPressCollection<short>&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&)::Pair>
                ((vector<adjustKeyPresses<short>(stKeyPressCollection<short>&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&)::Pair,std::allocator<adjustKeyPresses<short>(stKeyPressCollection<short>&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&)::Pair>>
                  *)&ccpairs,(Pair *)&used);
      lVar8 = lVar8 + 0x10;
    }
    uVar12 = local_b0 + 1;
    lVar8 = local_98 + 0x10;
    uVar7 = local_a8;
  }
  local_b1 = false;
  std::vector<bool,_std::allocator<bool>_>::vector(&used,(long)iVar5,&local_b1,&local_b2);
  std::
  __sort<__gnu_cxx::__normal_iterator<adjustKeyPresses<short>(stKeyPressCollection<short>&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&)::Pair*,std::vector<adjustKeyPresses<short>(stKeyPressCollection<short>&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&)::Pair,std::allocator<adjustKeyPresses<short>(stKeyPressCollection<short>&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&)::Pair>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (ccpairs.super__Vector_base<Pair,_std::allocator<Pair>_>._M_impl.super__Vector_impl_data
             ._M_start,
             ccpairs.super__Vector_base<Pair,_std::allocator<Pair>_>._M_impl.super__Vector_impl_data
             ._M_finish);
  uVar7 = (ulong)((long)ccpairs.super__Vector_base<Pair,_std::allocator<Pair>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)ccpairs.super__Vector_base<Pair,_std::allocator<Pair>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 4;
  uVar6 = 0;
  uVar12 = uVar7 & 0xffffffff;
  if ((int)uVar7 < 1) {
    uVar12 = uVar6;
  }
  local_b0 = local_b0 & 0xffffffff00000000;
  lVar8 = 0;
  pTVar11 = local_90;
  for (; uVar12 << 4 != uVar6; uVar6 = uVar6 + 0x10) {
    __n_00 = (size_type)
             *(int *)((long)&(ccpairs.super__Vector_base<Pair,_std::allocator<Pair>_>._M_impl.
                              super__Vector_impl_data._M_start)->i + uVar6);
    __n = (size_type)
          *(int *)((long)&(ccpairs.super__Vector_base<Pair,_std::allocator<Pair>_>._M_impl.
                           super__Vector_impl_data._M_start)->j + uVar6);
    rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[](&used,__n_00);
    if (((*rVar13._M_p & rVar13._M_mask) == 0) ||
       (rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[](&used,__n),
       (*rVar13._M_p & rVar13._M_mask) == 0)) {
      lVar9 = __n * 0x10;
      local_a0 = CONCAT71(local_a0._1_7_,
                          *(long *)(*(long *)&(pTVar11->
                                              super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start[__n_00].
                                              super__Vector_base<stMatch,_std::allocator<stMatch>_>.
                                              _M_impl.super__Vector_impl_data + 8 + lVar9) != 0);
      local_a8 = uVar6;
      local_98 = lVar8;
      rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[](&used,__n);
      pvVar2 = (pTVar11->
               super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar8 = *(long *)&pvVar2[__n_00].super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl
                        .super__Vector_impl_data;
      lVar3 = *(long *)(lVar8 + 8 + lVar9);
      psVar4 = (keyPresses->
               super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
               super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((*rVar13._M_p & rVar13._M_mask) == 0) {
        pTVar1 = &psVar4[__n].pos;
        *pTVar1 = *pTVar1 + lVar3;
      }
      else {
        pTVar1 = &psVar4[__n_00].pos;
        *pTVar1 = *pTVar1 - lVar3;
      }
      iVar10 = (int)local_b0;
      *(undefined8 *)(lVar8 + 8 + lVar9) = 0;
      *(undefined8 *)
       (*(long *)&pvVar2[__n].super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl.
                  super__Vector_impl_data + 8 + __n_00 * 0x10) = 0;
      rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[](&used,__n_00);
      lVar8 = local_98;
      if ((*rVar13._M_p & rVar13._M_mask) == 0) {
        rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[](&used,__n_00);
        *rVar13._M_p = *rVar13._M_p | rVar13._M_mask;
        iVar10 = iVar10 + 1;
      }
      uVar6 = local_a8;
      rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[](&used,__n);
      if ((*rVar13._M_p & rVar13._M_mask) == 0) {
        rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[](&used,__n);
        *rVar13._M_p = *rVar13._M_p | rVar13._M_mask;
        iVar10 = iVar10 + 1;
      }
      lVar8 = CONCAT71((int7)((ulong)lVar8 >> 8),(byte)lVar8 | (byte)local_a0);
      local_b0 = CONCAT44(local_b0._4_4_,iVar10);
      pTVar11 = local_90;
      if (iVar10 == iVar5) break;
    }
  }
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&used.super__Bvector_base<std::allocator<bool>_>);
  std::_Vector_base<Pair,_std::allocator<Pair>_>::~_Vector_base
            (&ccpairs.super__Vector_base<Pair,_std::allocator<Pair>_>);
  return (bool)((byte)lVar8 & 1);
}

Assistant:

bool adjustKeyPresses(TKeyPressCollectionT<T> & keyPresses, TSimilarityMap & sim) {
    struct Pair {
        int i = -1;
        int j = -1;
        TValueCC cc = -1.0;

        bool operator < (const Pair & a) const { return cc > a.cc; }
    };

    bool res = false;

    int n = keyPresses.size();

    std::vector<Pair> ccpairs;
    for (int i = 0; i < n - 1; ++i) {
        for (int j = i + 1; j < n; ++j) {
            ccpairs.emplace_back(Pair{i, j, sim[i][j].cc});
        }
    }

    int nused = 0;
    std::vector<bool> used(n, false);

    std::sort(ccpairs.begin(), ccpairs.end());

    int npairs = ccpairs.size();
    for (int ip = 0; ip < npairs; ++ip) {
        auto & curpair = ccpairs[ip];
        int k0 = curpair.i;
        int k1 = curpair.j;
        if (used[k0] && used[k1]) continue;

        if (sim[k0][k1].offset != 0) res = true;

        if (used[k1] == false) {
            keyPresses[k1].pos += sim[k0][k1].offset;
        } else {
            keyPresses[k0].pos -= sim[k0][k1].offset;
        }

        sim[k0][k1].offset = 0;
        sim[k1][k0].offset = 0;

        if (used[k0] == false) { used[k0] = true; ++nused; }
        if (used[k1] == false) { used[k1] = true; ++nused; }

        if (nused == n) break;
    }

    return res;
}